

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_ctype.c
# Opt level: O0

CTypeID lj_ctype_new(CTState *cts,CType **ctp)

{
  void *pvVar1;
  undefined4 *puVar2;
  lua_State *in_RSI;
  long *in_RDI;
  CType *ct;
  CTypeID id;
  MSize in_stack_ffffffffffffffd8;
  ErrMsg in_stack_ffffffffffffffdc;
  lua_State *in_stack_ffffffffffffffe0;
  undefined4 in_stack_ffffffffffffffe8;
  uint uVar3;
  
  uVar3 = *(uint *)(in_RDI + 1);
  if (*(uint *)((long)in_RDI + 0xc) <= uVar3) {
    if (0xffff < uVar3) {
      lj_err_msg(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffdc);
    }
    pvVar1 = lj_mem_grow(in_RSI,(void *)CONCAT44(uVar3,in_stack_ffffffffffffffe8),
                         (MSize *)in_stack_ffffffffffffffe0,in_stack_ffffffffffffffdc,
                         in_stack_ffffffffffffffd8);
    *in_RDI = (long)pvVar1;
  }
  *(uint *)(in_RDI + 1) = uVar3 + 1;
  puVar2 = (undefined4 *)(*in_RDI + (ulong)uVar3 * 0x10);
  *(undefined4 **)in_RSI = puVar2;
  *puVar2 = 0;
  puVar2[1] = 0;
  *(undefined2 *)(puVar2 + 2) = 0;
  *(undefined2 *)((long)puVar2 + 10) = 0;
  puVar2[3] = 0;
  return uVar3;
}

Assistant:

CTypeID lj_ctype_new(CTState *cts, CType **ctp)
{
  CTypeID id = cts->top;
  CType *ct;
  lj_assertCTS(cts->L, "uninitialized cts->L");
  if (LJ_UNLIKELY(id >= cts->sizetab)) {
    if (id >= CTID_MAX) lj_err_msg(cts->L, LJ_ERR_TABOV);
#ifdef LUAJIT_CTYPE_CHECK_ANCHOR
    ct = lj_mem_newvec(cts->L, id+1, CType);
    memcpy(ct, cts->tab, id*sizeof(CType));
    memset(cts->tab, 0, id*sizeof(CType));
    lj_mem_freevec(cts->g, cts->tab, cts->sizetab, CType);
    cts->tab = ct;
    cts->sizetab = id+1;
#else
    lj_mem_growvec(cts->L, cts->tab, cts->sizetab, CTID_MAX, CType);
#endif
  }
  cts->top = id+1;
  *ctp = ct = &cts->tab[id];
  ct->info = 0;
  ct->size = 0;
  ct->sib = 0;
  ct->next = 0;
  setgcrefnull(ct->name);
  return id;
}